

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  _Alloc_hider *p_Var5;
  char *pcVar6;
  size_type sVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  _Alloc_hider __s;
  string *psVar11;
  string *psVar12;
  iterator iVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  long *plVar14;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  undefined4 extraout_var_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_04;
  size_t sVar15;
  ostream *poVar16;
  undefined7 in_register_00000009;
  ulong *puVar17;
  ulong uVar18;
  size_type *psVar19;
  MessageType MVar20;
  uint __len;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  string *psVar21;
  string *psVar22;
  string varresult;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string result;
  t_lookup lookup;
  ostringstream ostr;
  string local_2c0;
  string *local_2a0;
  string local_298;
  MessageType local_274;
  cmMakefile *local_270;
  string *local_268;
  iterator iStack_260;
  t_lookup *local_258;
  char *local_250;
  string *local_248;
  char local_240;
  undefined7 uStack_23f;
  ulong local_230;
  undefined4 local_224;
  string local_220;
  undefined4 local_200;
  undefined4 local_1fc;
  string local_1f8;
  string *local_1d8;
  string *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  unsigned_long local_1c0;
  RegularExpression *local_1b8;
  cmState *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = CONCAT31(in_register_00000089,atOnly);
  local_1fc = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_224 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  psVar11 = (string *)(source->_M_dataplus)._M_p;
  local_250 = &local_240;
  local_248 = (string *)0x0;
  local_240 = '\0';
  local_2a0 = errorstr;
  std::__cxx11::string::reserve((ulong)&local_250);
  local_268 = (string *)0x0;
  iStack_260._M_current = (t_lookup *)0x0;
  local_258 = (t_lookup *)0x0;
  local_1b0 = this->GlobalGenerator->CMakeInstance->State;
  local_1d0 = source;
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                    ::lineVar_abi_cxx11_), iVar10 != 0)) {
    ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
    ::lineVar_abi_cxx11_._M_dataplus._M_p =
         (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                   ::lineVar_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  local_230 = line;
  iVar13._M_current = (t_lookup *)&this->cmNamedCurly;
  local_274 = LOG;
  local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  bVar4 = false;
  psVar12 = psVar11;
  local_270 = this;
  local_1b8 = (RegularExpression *)iVar13._M_current;
  do {
    bVar1 = *(byte *)&(psVar11->_M_dataplus)._M_p;
    psVar21 = psVar12;
    if (bVar1 < 0x40) {
      if (bVar1 == 0) {
        iVar13._M_current = (t_lookup *)CONCAT71((int7)((ulong)iVar13._M_current >> 8),1);
        local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)iVar13._M_current;
      }
      else if (bVar1 == 10) {
        local_230 = local_230 + 1;
      }
      else {
        if (bVar1 != 0x24) goto LAB_00185aa8;
        if ((char)local_200 != '\0') goto LAB_0018512b;
        uVar18 = (ulong)local_220._M_dataplus._M_p >> 0x20;
        local_220._M_dataplus._M_p = (pointer)(uVar18 << 0x20);
        local_220._M_string_length = 0;
        psVar21 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1);
        cVar2 = *(char *)((long)&(psVar11->_M_dataplus)._M_p + 1);
        iVar13._M_current = (t_lookup *)0x0;
        if (cVar2 == '\0') {
          iVar13._M_current =
               (t_lookup *)std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
          psVar22 = (string *)0x0;
        }
        else if (cVar2 == '<') {
LAB_001858f8:
          psVar22 = (string *)0x0;
          psVar21 = psVar12;
        }
        else if (cVar2 == '{') {
          psVar22 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 2);
          local_220._M_dataplus._M_p = (pointer)(uVar18 << 0x20);
          psVar21 = psVar12;
        }
        else {
          iVar10 = strncmp((char *)psVar21,"ENV{",4);
          iVar13._M_current = (t_lookup *)CONCAT44(extraout_var_00,iVar10);
          if (iVar10 == 0) {
            psVar22 = (string *)((long)&psVar11->_M_dataplus + 5);
            local_220._M_dataplus._M_p._0_4_ = 1;
            psVar21 = psVar12;
          }
          else {
            iVar10 = strncmp((char *)psVar21,"CACHE{",6);
            iVar13._M_current = (t_lookup *)CONCAT44(extraout_var_01,iVar10);
            if (iVar10 != 0) {
              bVar9 = cmsys::RegularExpression::find(local_1b8,(char *)psVar21,&local_1b8->regmatch)
              ;
              iVar13._M_current = (t_lookup *)CONCAT71(extraout_var,bVar9);
              if (bVar9) {
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_298,psVar21,
                           (char *)((long)psVar21 +
                                   ((long)(local_270->cmNamedCurly).regmatch.endp[0] -
                                   (long)(local_270->cmNamedCurly).regmatch.searchstring)));
                plVar14 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_298,0,(char *)0x0,0x4aae84);
                puVar17 = (ulong *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar17) {
                  local_2c0.field_2._M_allocated_capacity = *puVar17;
                  local_2c0.field_2._8_8_ = plVar14[3];
                  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                }
                else {
                  local_2c0.field_2._M_allocated_capacity = *puVar17;
                  local_2c0._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_2c0._M_string_length = plVar14[1];
                *plVar14 = (long)puVar17;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_2c0);
                psVar19 = (size_type *)(plVar14 + 2);
                if ((size_type *)*plVar14 == psVar19) {
                  local_1a8._16_8_ = *psVar19;
                  local_1a8._24_8_ = plVar14[3];
                  local_1a8._0_8_ = local_1a8 + 0x10;
                }
                else {
                  local_1a8._16_8_ = *psVar19;
                  local_1a8._0_8_ = (size_type *)*plVar14;
                }
                local_1a8._8_8_ = plVar14[1];
                *plVar14 = (long)psVar19;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_2a0,(string *)local_1a8);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                  operator_delete(local_2c0._M_dataplus._M_p,
                                  local_2c0.field_2._M_allocated_capacity + 1);
                }
                iVar13._M_current = (t_lookup *)&local_298.field_2;
                if ((t_lookup *)local_298._M_dataplus._M_p != iVar13._M_current) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                           local_298.field_2._M_local_buf[0]) + 1);
                  iVar13._M_current = (t_lookup *)extraout_RAX_00;
                }
                bVar4 = true;
                local_274 = FATAL_ERROR;
              }
              goto LAB_001858f8;
            }
            psVar22 = (string *)((long)&psVar11->_M_dataplus + 7);
            local_220._M_dataplus._M_p._0_4_ = 2;
            psVar21 = psVar12;
          }
        }
        if (psVar22 != (string *)0x0) {
          std::__cxx11::string::append((char *)&local_250,(ulong)psVar21);
          psVar11 = (string *)((long)(psVar22 + 0xffffffffffffffff) + 0x1f);
          local_220._M_string_length = (size_type)local_248;
          psVar21 = psVar22;
          if (iStack_260._M_current == local_258) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_268,iStack_260,
                       (t_lookup *)&local_220);
            iVar13._M_current = (t_lookup *)extraout_RAX_01;
          }
          else {
            *(pointer *)iStack_260._M_current = local_220._M_dataplus._M_p;
            (iStack_260._M_current)->loc = (size_t)local_248;
            iStack_260._M_current = iStack_260._M_current + 1;
            iVar13._M_current = (t_lookup *)local_248;
          }
        }
      }
    }
    else {
      if (bVar1 == 0x40) {
        if (replaceAt) {
          pcVar6 = (char *)((long)&(psVar11->_M_dataplus)._M_p + 1);
          iVar13._M_current = (t_lookup *)strchr(pcVar6,0x40);
          bVar9 = true;
          if (iVar13._M_current != (t_lookup *)pcVar6 &&
              (string *)iVar13._M_current != (string *)0x0) {
            local_1d8 = (string *)iVar13._M_current;
            sVar15 = strspn(pcVar6,
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-");
            iVar13._M_current = (t_lookup *)(pcVar6 + sVar15);
            if (local_1d8 == (string *)iVar13._M_current) {
              local_1a8._0_8_ = local_1a8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,pcVar6,pcVar6 + ~(ulong)psVar11 + (long)local_1d8);
              local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
              local_2c0._M_string_length = 0;
              local_2c0.field_2._M_allocated_capacity =
                   local_2c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
              if (((filename == (char *)0x0) ||
                  (local_1a8._8_8_ !=
                   ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                   ::lineVar_abi_cxx11_._M_string_length)) ||
                 ((local_1a8._8_8_ != 0 &&
                  (iVar10 = bcmp((void *)local_1a8._0_8_,
                                 ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                 ::lineVar_abi_cxx11_._M_dataplus._M_p,local_1a8._8_8_), iVar10 != 0
                  )))) {
                psVar11 = GetDef(local_270,(string *)local_1a8);
                if (psVar11 == (string *)0x0) {
                  if (local_270->SuppressSideEffects == false) {
                    MaybeWarnUninitialized(local_270,(string *)local_1a8,filename);
                  }
                }
                else {
                  std::__cxx11::string::_M_assign((string *)&local_2c0);
                }
              }
              else {
                local_1c0 = -local_230;
                if (0 < (long)local_230) {
                  local_1c0 = local_230;
                }
                __len = 1;
                if (9 < local_1c0) {
                  uVar18 = local_1c0;
                  uVar8 = 4;
                  do {
                    __len = uVar8;
                    if (uVar18 < 100) {
                      __len = __len - 2;
                      goto LAB_0018596e;
                    }
                    if (uVar18 < 1000) {
                      __len = __len - 1;
                      goto LAB_0018596e;
                    }
                    if (uVar18 < 10000) goto LAB_0018596e;
                    bVar9 = 99999 < uVar18;
                    uVar18 = uVar18 / 10000;
                    uVar8 = __len + 4;
                  } while (bVar9);
                  __len = __len + 1;
                }
LAB_0018596e:
                lVar3 = (long)local_230 >> 0x3f;
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_298,(char)__len - (char)((long)local_230 >> 0x3f));
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (local_298._M_dataplus._M_p + -lVar3,__len,local_1c0);
                std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                           local_298.field_2._M_local_buf[0]) + 1);
                }
              }
              if ((char)local_224 != '\0') {
                cmSystemTools::EscapeQuotes(&local_298,&local_2c0);
                std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                           local_298.field_2._M_local_buf[0]) + 1);
                }
              }
              std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
              std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_2c0._M_dataplus._M_p);
              iVar13._M_current = (t_lookup *)&local_2c0.field_2;
              if ((t_lookup *)local_2c0._M_dataplus._M_p != iVar13._M_current) {
                operator_delete(local_2c0._M_dataplus._M_p,
                                local_2c0.field_2._M_allocated_capacity + 1);
                iVar13._M_current = (t_lookup *)extraout_RAX_02;
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                iVar13._M_current = (t_lookup *)extraout_RAX_03;
              }
              psVar12 = (string *)((long)&(local_1d8->_M_dataplus)._M_p + 1);
              bVar9 = false;
              psVar11 = local_1d8;
            }
          }
          psVar21 = psVar12;
          if (!bVar9) goto LAB_00185adf;
        }
      }
      else {
        if (bVar1 == 0x5c) {
LAB_0018512b:
          if ((char)local_1fc != '\0') goto LAB_00185adf;
          pcVar6 = (char *)((long)&(psVar11->_M_dataplus)._M_p + 1);
          bVar1 = *(char *)((long)&(psVar11->_M_dataplus)._M_p + 1);
          if (bVar1 < 0x72) {
            if (bVar1 == 0x3b) {
              iVar13._M_current = (t_lookup *)local_268;
              if (local_268 == (string *)iStack_260._M_current) goto LAB_00185511;
            }
            else if (bVar1 == 0x6e) {
              std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
              iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_250);
              goto LAB_001853e2;
            }
LAB_00185387:
            iVar10 = isalnum((int)(char)bVar1);
            if ((bVar1 == 0) || (iVar10 != 0)) {
              std::__cxx11::string::append((char *)local_2a0);
              if (bVar1 != 0) {
                std::__cxx11::string::push_back((char)local_2a0);
              }
              bVar4 = true;
              iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)local_2a0);
            }
            else {
              iVar13._M_current =
                   (t_lookup *)std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
              psVar12 = (string *)pcVar6;
            }
          }
          else {
            if (bVar1 == 0x72) {
              std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
              iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_250);
            }
            else {
              if (bVar1 != 0x74) goto LAB_00185387;
              std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
              iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_250);
            }
LAB_001853e2:
            psVar12 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 2);
          }
LAB_00185511:
          psVar21 = psVar12;
          if (*(char *)&(psVar12->_M_dataplus)._M_p != '\0') {
            psVar11 = (string *)pcVar6;
          }
          goto LAB_00185adf;
        }
        if (bVar1 == 0x7d) {
          iVar13._M_current = iStack_260._M_current;
          if (local_268 == (string *)iStack_260._M_current) goto LAB_00185adf;
          iVar10 = *(int *)((long)iStack_260._M_current + 0xffffffffffffffe0U + 0x10);
          uVar18 = *(ulong *)((long)iStack_260._M_current + 0xffffffffffffffe0U + 0x18);
          iStack_260._M_current =
               (t_lookup *)((long)iStack_260._M_current + 0xffffffffffffffe0U + 0x10);
          std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
          std::__cxx11::string::substr((ulong)&local_2c0,(ulong)&local_250);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          local_298._M_string_length = 0;
          local_298.field_2._M_local_buf[0] = '\0';
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          local_220._M_string_length = 0;
          local_220.field_2._M_local_buf[0] = '\0';
          if (iVar10 == 0) {
            if (((filename == (char *)0x0) ||
                (local_2c0._M_string_length !=
                 ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                 ::lineVar_abi_cxx11_._M_string_length)) ||
               ((local_2c0._M_string_length != 0 &&
                (iVar10 = bcmp(local_2c0._M_dataplus._M_p,
                               ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                               ::lineVar_abi_cxx11_._M_dataplus._M_p,local_2c0._M_string_length),
                iVar10 != 0)))) {
              psVar12 = GetDef(local_270,&local_2c0);
              if (psVar12 != (string *)0x0) {
                __s._M_p = (pointer)(psVar12->_M_dataplus)._M_p;
                goto LAB_001855c1;
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::ostream::_M_insert<long>((long)local_1a8);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
LAB_001855be:
            __s._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0;
          }
          else if (iVar10 == 1) {
            bVar9 = cmsys::SystemTools::GetEnv(&local_2c0,&local_220);
            __s._M_p = local_220._M_dataplus._M_p;
            if (!bVar9) goto LAB_001855be;
          }
          else {
            __s._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0;
            if (iVar10 == 2) {
              __s._M_p = cmState::GetCacheEntryValue(local_1b0,&local_2c0);
            }
          }
LAB_001855c1:
          sVar7 = local_298._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__s._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            if (local_270->SuppressSideEffects == false) {
              MaybeWarnUninitialized(local_270,&local_2c0,filename);
            }
          }
          else if ((char)local_224 == '\0') {
            strlen(__s._M_p);
            std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)sVar7,(ulong)__s._M_p);
          }
          else {
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            sVar15 = strlen(__s._M_p);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f8,__s._M_p,__s._M_p + sVar15);
            cmSystemTools::EscapeQuotes((string *)local_1a8,&local_1f8);
            std::__cxx11::string::operator=((string *)&local_298,(string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::string::replace
                    ((ulong)&local_250,uVar18,(char *)((long)local_248 - uVar18),
                     (ulong)local_298._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,
                            CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                     local_220.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,
                            CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                     local_298.field_2._M_local_buf[0]) + 1);
          }
          iVar13._M_current = (t_lookup *)&local_2c0.field_2;
          if ((t_lookup *)local_2c0._M_dataplus._M_p != iVar13._M_current) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
            iVar13._M_current = (t_lookup *)extraout_RAX;
          }
          psVar21 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1);
          goto LAB_00185adf;
        }
      }
LAB_00185aa8:
      iVar13._M_current = (t_lookup *)local_268;
      psVar21 = psVar12;
      if (local_268 != (string *)iStack_260._M_current) {
        iVar10 = isalnum((int)(char)bVar1);
        iVar13._M_current = (t_lookup *)CONCAT44(extraout_var_02,iVar10);
        if ((iVar10 == 0) &&
           ((iVar13._M_current = (t_lookup *)(ulong)(bVar1 - 0x2b), 0x34 < bVar1 - 0x2b ||
            ((0x1000000000001dU >> ((ulong)iVar13._M_current & 0x3f) & 1) == 0)))) {
          std::__cxx11::string::append((char *)local_2a0);
          std::__cxx11::string::push_back((char)local_2a0);
          std::__cxx11::string::append((char *)&local_250,(ulong)psVar12);
          std::__cxx11::string::substr((ulong)&local_298,(ulong)&local_250);
          plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x4aaf59);
          puVar17 = (ulong *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_2c0.field_2._M_allocated_capacity = *puVar17;
            local_2c0.field_2._8_8_ = plVar14[3];
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *puVar17;
            local_2c0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_2c0._M_string_length = plVar14[1];
          *plVar14 = (long)puVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_2c0);
          local_1a8._0_8_ = local_1a8 + 0x10;
          psVar19 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar19) {
            local_1a8._16_8_ = *psVar19;
            local_1a8._24_8_ = plVar14[3];
          }
          else {
            local_1a8._16_8_ = *psVar19;
            local_1a8._0_8_ = (size_type *)*plVar14;
          }
          local_1a8._8_8_ = plVar14[1];
          *plVar14 = (long)psVar19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_2a0,local_1a8._0_8_);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          iVar13._M_current = (t_lookup *)&local_298.field_2;
          if ((t_lookup *)local_298._M_dataplus._M_p != iVar13._M_current) {
            operator_delete(local_298._M_dataplus._M_p,
                            CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                     local_298.field_2._M_local_buf[0]) + 1);
            iVar13._M_current = (t_lookup *)extraout_RAX_04;
          }
          bVar4 = true;
          local_274 = FATAL_ERROR;
        }
      }
    }
LAB_00185adf:
    MVar20 = local_274;
    if (bVar4) goto LAB_00185ccf;
  } while ((((ulong)local_1c8 & 1) == 0) &&
          (p_Var5 = &psVar11->_M_dataplus,
          psVar11 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1), psVar12 = psVar21,
          *(char *)((long)&p_Var5->_M_p + 1) != '\0'));
  if (local_268 != (string *)iStack_260._M_current) {
    bVar4 = true;
    std::__cxx11::string::append((char *)local_2a0);
  }
LAB_00185ccf:
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      sVar15 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar16 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_1d0->_M_dataplus)._M_p,
                         local_1d0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    MVar20 = FATAL_ERROR;
  }
  else {
    std::__cxx11::string::append((char *)&local_250);
    std::__cxx11::string::_M_assign((string *)local_1d0);
  }
  if (local_268 != (string *)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  return MVar20;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = svalue.c_str();
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(value);
            } else {
              varresult = value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              const std::string* def = this->GetDef(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
      // Failed to find a valid @ expansion; treat it as literal.
      /* FALLTHROUGH */
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}